

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigMan.c
# Opt level: O0

void Fraig_ManAddClause(Fraig_Man_t *p,Fraig_Node_t **ppNodes,int nNodes)

{
  int iVar1;
  int RetValue;
  int fComp;
  int i;
  Fraig_Node_t *pNode;
  int nNodes_local;
  Fraig_Node_t **ppNodes_local;
  Fraig_Man_t *p_local;
  
  if (p->pSat == (Msat_Solver_t *)0x0) {
    Fraig_ManCreateSolver(p);
  }
  Msat_IntVecClear(p->vProj);
  for (RetValue = 0; RetValue < nNodes; RetValue = RetValue + 1) {
    Msat_IntVecPush(p->vProj,*(int *)((ulong)ppNodes[RetValue] & 0xfffffffffffffffe) * 2 +
                             ((uint)ppNodes[RetValue] & 1));
  }
  iVar1 = Msat_SolverAddClause(p->pSat,p->vProj);
  if (iVar1 != 0) {
    return;
  }
  __assert_fail("RetValue",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigMan.c"
                ,0x21a,"void Fraig_ManAddClause(Fraig_Man_t *, Fraig_Node_t **, int)");
}

Assistant:

void Fraig_ManAddClause( Fraig_Man_t * p, Fraig_Node_t ** ppNodes, int nNodes )
{
    Fraig_Node_t * pNode;
    int i, fComp, RetValue;
    if ( p->pSat == NULL )
        Fraig_ManCreateSolver( p );
    // create four clauses
    Msat_IntVecClear( p->vProj );
    for ( i = 0; i < nNodes; i++ )
    {
        pNode = Fraig_Regular(ppNodes[i]);
        fComp = Fraig_IsComplement(ppNodes[i]);
        Msat_IntVecPush( p->vProj, MSAT_VAR2LIT(pNode->Num, fComp) );
//        printf( "%d(%d) ", pNode->Num, fComp );
    }
//    printf( "\n" );
    RetValue = Msat_SolverAddClause( p->pSat, p->vProj );
    assert( RetValue );
}